

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vpgen_segmentator.cpp
# Opt level: O1

void __thiscall agg::vpgen_segmentator::move_to(vpgen_segmentator *this,double x,double y)

{
  *(double *)(this + 8) = x;
  *(double *)(this + 0x10) = y;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0x4000000000000000;
  *(undefined8 *)(this + 0x30) = 0x4000000000000000;
  *(undefined4 *)(this + 0x38) = 1;
  return;
}

Assistant:

void vpgen_segmentator::move_to(double x, double y)
    {
        m_x1 = x;
        m_y1 = y;
        m_dx = 0.0;
        m_dy = 0.0;
        m_dl = 2.0;
        m_ddl = 2.0;
        m_cmd = path_cmd_move_to;
    }